

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  Boolean BVar4;
  int iVar5;
  ostream *poVar6;
  ulong uVar7;
  GSFloodFill<unsigned_char> *pGVar8;
  long lVar9;
  vector<int,_std::allocator<int>_> local_4b8;
  _InputArray local_498;
  allocator<char> local_479;
  string local_478 [32];
  _InputArray local_458;
  allocator<char> local_439;
  string local_438 [39];
  allocator<char> local_411;
  string local_410 [32];
  _OutputArray local_3f0;
  vector<int,_std::allocator<int>_> local_3d8;
  _InputArray local_3b8;
  allocator<char> local_399;
  string local_398 [32];
  _InputArray local_378;
  allocator<char> local_359;
  string local_358 [39];
  allocator<char> local_331;
  string local_330 [32];
  GSFloodFill<unsigned_char> *local_310;
  GSFloodFill<unsigned_char> *floodFill;
  int disp_2;
  int i_3;
  int disp_1;
  int i_2;
  int disp;
  int i_1;
  uchar *buffb;
  uchar *buffg;
  uchar *buffr;
  uchar **b;
  uchar **g;
  uchar **r;
  _InputArray local_2a8;
  allocator<char> local_289;
  string local_288 [39];
  allocator<char> local_261;
  string local_260 [32];
  string local_240 [96];
  undefined4 local_1e0;
  int local_1d0;
  int verbose;
  int iStack_1c4;
  Boolean error;
  int cols;
  int rows;
  string XSDPath;
  Mat diff;
  undefined1 local_140 [8];
  Mat dst;
  undefined1 local_e0 [8];
  Mat src;
  int local_d4;
  string local_80 [8];
  string dFileName;
  string oFileName;
  string iFileName;
  int j;
  int i;
  char **argv_local;
  int argc_local;
  
  std::__cxx11::string::string((string *)(oFileName.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(dFileName.field_2._M_local_buf + 8));
  std::__cxx11::string::string(local_80);
  cv::Mat::Mat((Mat *)local_e0);
  cv::Mat::Mat((Mat *)local_140);
  cv::Mat::Mat((Mat *)(XSDPath.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&cols);
  local_1d0 = 0;
  if (1 < argc) {
    for (iFileName.field_2._12_4_ = 1; (int)iFileName.field_2._12_4_ < argc;
        iFileName.field_2._12_4_ = iFileName.field_2._12_4_ + 1) {
      if (*argv[(int)iFileName.field_2._12_4_] == '-') {
        switch(argv[(int)iFileName.field_2._12_4_][1]) {
        case 'd':
          lVar9 = (long)(int)iFileName.field_2._12_4_;
          iFileName.field_2._12_4_ = iFileName.field_2._12_4_ + 1;
          std::__cxx11::string::operator=(local_80,argv[lVar9 + 1]);
          break;
        default:
          poVar6 = std::operator<<((ostream *)&std::cerr,"Unknown switch.\n");
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          printHelp();
          argv_local._4_4_ = -1;
          goto LAB_0010db27;
        case 'h':
          printHelp();
          argv_local._4_4_ = 0;
          goto LAB_0010db27;
        case 'i':
          lVar9 = (long)(int)iFileName.field_2._12_4_;
          iFileName.field_2._12_4_ = iFileName.field_2._12_4_ + 1;
          std::__cxx11::string::operator=
                    ((string *)(oFileName.field_2._M_local_buf + 8),argv[lVar9 + 1]);
          break;
        case 'o':
          lVar9 = (long)(int)iFileName.field_2._12_4_;
          iFileName.field_2._12_4_ = iFileName.field_2._12_4_ + 1;
          std::__cxx11::string::operator=
                    ((string *)(dFileName.field_2._M_local_buf + 8),argv[lVar9 + 1]);
          break;
        case 'v':
          local_1d0 = 1;
          break;
        case 'x':
          lVar9 = (long)(int)iFileName.field_2._12_4_;
          iFileName.field_2._12_4_ = iFileName.field_2._12_4_ + 1;
          std::__cxx11::string::operator=((string *)&cols,argv[lVar9 + 1]);
        }
      }
    }
  }
  uVar7 = std::__cxx11::string::empty();
  if ((uVar7 & 1) == 0) {
    uVar7 = std::__cxx11::string::empty();
    if ((uVar7 & 1) != 0) {
      std::operator<<((ostream *)&std::cerr,
                      "Option -o <filename> is missing. Output file name is set to \'output.jpg\'\n"
                     );
      std::__cxx11::string::operator=((string *)(dFileName.field_2._M_local_buf + 8),"output.jpg");
    }
    cv::imread(local_240,(int)&oFileName + 0x18);
    cv::Mat::operator=((Mat *)local_e0,(Mat *)local_240);
    cv::Mat::~Mat((Mat *)local_240);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_260,"Input image",&local_261);
    cv::namedWindow(local_260,1);
    std::__cxx11::string::~string(local_260);
    std::allocator<char>::~allocator(&local_261);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_288,"Input image",&local_289);
    cv::_InputArray::_InputArray(&local_2a8,(Mat *)local_e0);
    cv::imshow(local_288,&local_2a8);
    cv::_InputArray::~_InputArray(&local_2a8);
    std::__cxx11::string::~string(local_288);
    std::allocator<char>::~allocator(&local_289);
    poVar6 = std::operator<<((ostream *)&std::cout,"Image ");
    poVar6 = std::operator<<(poVar6,(string *)(oFileName.field_2._M_local_buf + 8));
    poVar6 = std::operator<<(poVar6," consists of ");
    iVar5 = cv::Mat::channels((Mat *)local_e0);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar5);
    poVar6 = std::operator<<(poVar6," channels and ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_d4);
    poVar6 = std::operator<<(poVar6,"x");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,_src);
    std::operator<<(poVar6," pixels.\n");
    cv::_OutputArray::_OutputArray((_OutputArray *)&r,(Mat *)local_140);
    cv::Mat::copyTo((_OutputArray *)local_e0);
    cv::_OutputArray::~_OutputArray((_OutputArray *)&r);
    verbose = local_d4;
    iStack_1c4 = _src;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)_src;
    uVar7 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar7 = 0xffffffffffffffff;
    }
    g = (uchar **)operator_new__(uVar7);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)iStack_1c4;
    uVar7 = SUB168(auVar2 * ZEXT816(8),0);
    if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
      uVar7 = 0xffffffffffffffff;
    }
    b = (uchar **)operator_new__(uVar7);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = (long)iStack_1c4;
    uVar7 = SUB168(auVar3 * ZEXT816(8),0);
    if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
      uVar7 = 0xffffffffffffffff;
    }
    buffr = (uchar *)operator_new__(uVar7);
    buffg = (uchar *)operator_new__((long)(verbose * iStack_1c4));
    buffb = (uchar *)operator_new__((long)(verbose * iStack_1c4));
    _disp = operator_new__((long)(verbose * iStack_1c4));
    disp_1 = 0;
    for (i_2 = 0; i_2 < iStack_1c4; i_2 = i_2 + 1) {
      g[i_2] = buffg + disp_1;
      disp_1 = verbose + disp_1;
    }
    disp_2 = 0;
    for (i_3 = 0; i_3 < iStack_1c4; i_3 = i_3 + 1) {
      b[i_3] = buffb + disp_2;
      disp_2 = verbose + disp_2;
    }
    floodFill._0_4_ = 0;
    for (floodFill._4_4_ = 0; floodFill._4_4_ < iStack_1c4; floodFill._4_4_ = floodFill._4_4_ + 1) {
      *(long *)(buffr + (long)floodFill._4_4_ * 8) = (long)_disp + (long)(int)floodFill;
      floodFill._0_4_ = verbose + (int)floodFill;
    }
    fromMat2RGB((Mat *)local_e0,g,b,(uchar **)buffr);
    pGVar8 = (GSFloodFill<unsigned_char> *)operator_new(0xa0);
    GSFloodFill<unsigned_char>::GSFloodFill(pGVar8,g,iStack_1c4,verbose);
    local_310 = pGVar8;
    GSFloodFill<unsigned_char>::setVerbose(pGVar8,local_1d0);
    BVar4 = GSFloodFill<unsigned_char>::Transform(local_310);
    pGVar8 = local_310;
    if (BVar4) {
      if (local_310 != (GSFloodFill<unsigned_char> *)0x0) {
        GSFloodFill<unsigned_char>::~GSFloodFill(local_310);
        operator_delete(pGVar8,0xa0);
      }
      pGVar8 = (GSFloodFill<unsigned_char> *)operator_new(0xa0);
      GSFloodFill<unsigned_char>::GSFloodFill(pGVar8,b,iStack_1c4,verbose);
      local_310 = pGVar8;
      GSFloodFill<unsigned_char>::setVerbose(pGVar8,local_1d0);
      BVar4 = GSFloodFill<unsigned_char>::Transform(local_310);
      pGVar8 = local_310;
      if (BVar4) {
        if (local_310 != (GSFloodFill<unsigned_char> *)0x0) {
          GSFloodFill<unsigned_char>::~GSFloodFill(local_310);
          operator_delete(pGVar8,0xa0);
        }
        pGVar8 = (GSFloodFill<unsigned_char> *)operator_new(0xa0);
        GSFloodFill<unsigned_char>::GSFloodFill(pGVar8,(uchar **)buffr,iStack_1c4,verbose);
        local_310 = pGVar8;
        GSFloodFill<unsigned_char>::setVerbose(pGVar8,local_1d0);
        BVar4 = GSFloodFill<unsigned_char>::Transform(local_310);
        pGVar8 = local_310;
        if (BVar4) {
          if (local_310 != (GSFloodFill<unsigned_char> *)0x0) {
            GSFloodFill<unsigned_char>::~GSFloodFill(local_310);
            operator_delete(pGVar8,0xa0);
          }
          fromRGB2Mat((Mat *)local_140,g,b,(uchar **)buffr);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (local_330,"Flood-filled image",&local_331);
          cv::namedWindow(local_330,1);
          std::__cxx11::string::~string(local_330);
          std::allocator<char>::~allocator(&local_331);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (local_358,"Flood-filled image",&local_359);
          cv::_InputArray::_InputArray(&local_378,(Mat *)local_140);
          cv::imshow(local_358,&local_378);
          cv::_InputArray::~_InputArray(&local_378);
          std::__cxx11::string::~string(local_358);
          std::allocator<char>::~allocator(&local_359);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>(local_398,"FloodFilled.jpg",&local_399)
          ;
          cv::_InputArray::_InputArray(&local_3b8,(Mat *)local_140);
          local_3d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          local_3d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          local_3d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          std::vector<int,_std::allocator<int>_>::vector(&local_3d8);
          cv::imwrite(local_398,&local_3b8,(vector *)&local_3d8);
          std::vector<int,_std::allocator<int>_>::~vector(&local_3d8);
          cv::_InputArray::~_InputArray(&local_3b8);
          std::__cxx11::string::~string(local_398);
          std::allocator<char>::~allocator(&local_399);
          uVar7 = std::__cxx11::string::empty();
          if ((uVar7 & 1) == 0) {
            cv::_OutputArray::_OutputArray(&local_3f0,(Mat *)(XSDPath.field_2._M_local_buf + 8));
            cv::Mat::copyTo((_OutputArray *)local_140);
            cv::_OutputArray::~_OutputArray(&local_3f0);
            diffMat((Mat *)(XSDPath.field_2._M_local_buf + 8),(Mat *)local_e0);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (local_410,"Difference image",&local_411);
            cv::namedWindow(local_410,1);
            std::__cxx11::string::~string(local_410);
            std::allocator<char>::~allocator(&local_411);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (local_438,"Difference image",&local_439);
            cv::_InputArray::_InputArray(&local_458,(Mat *)(XSDPath.field_2._M_local_buf + 8));
            cv::imshow(local_438,&local_458);
            cv::_InputArray::~_InputArray(&local_458);
            std::__cxx11::string::~string(local_438);
            std::allocator<char>::~allocator(&local_439);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (local_478,"Difference.jpg",&local_479);
            cv::_InputArray::_InputArray(&local_498,(Mat *)(XSDPath.field_2._M_local_buf + 8));
            local_4b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)0x0;
            local_4b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = (pointer)0x0;
            local_4b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage = (pointer)0x0;
            std::vector<int,_std::allocator<int>_>::vector(&local_4b8);
            cv::imwrite(local_478,&local_498,(vector *)&local_4b8);
            std::vector<int,_std::allocator<int>_>::~vector(&local_4b8);
            cv::_InputArray::~_InputArray(&local_498);
            std::__cxx11::string::~string(local_478);
            std::allocator<char>::~allocator(&local_479);
          }
          cv::waitKey(0);
          argv_local._4_4_ = 0;
        }
        else {
          std::operator<<((ostream *)&std::cerr,"floodFill.Transform (b) has failed! Aborting...\n")
          ;
          argv_local._4_4_ = -1;
        }
      }
      else {
        std::operator<<((ostream *)&std::cerr,"floodFill.Transform (g) has failed! Aborting...\n");
        argv_local._4_4_ = -1;
      }
    }
    else {
      std::operator<<((ostream *)&std::cerr,"floodFill.Transform (r) has failed! Aborting...\n");
      argv_local._4_4_ = -1;
    }
  }
  else {
    std::operator<<((ostream *)&std::cerr,"Option -i <filename> must be present! Aborting...\n");
    argv_local._4_4_ = -1;
  }
LAB_0010db27:
  local_1e0 = 1;
  std::__cxx11::string::~string((string *)&cols);
  cv::Mat::~Mat((Mat *)(XSDPath.field_2._M_local_buf + 8));
  cv::Mat::~Mat((Mat *)local_140);
  cv::Mat::~Mat((Mat *)local_e0);
  std::__cxx11::string::~string(local_80);
  std::__cxx11::string::~string((string *)(dFileName.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(oFileName.field_2._M_local_buf + 8));
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char *argv[])
{
	int i, j;
	string iFileName;
	string oFileName;
	string dFileName;
	Mat src, dst, diff;
	string XSDPath;
	int rows, cols;
	Boolean error;
	int verbose;

	verbose=0;
	// manage command-line args
	if (argc>1)
	for (i=1; i<argc; i++)
		if (argv[i][0] == '-')
		switch(argv[i][1]) {
		case 'v': verbose=1; break;
		case 'h': printHelp(); return 0;
		case 'i': iFileName = argv[++i]; break;
		case 'o': oFileName = argv[++i]; break;
		case 'd': dFileName = argv[++i]; break;
		case 'x': XSDPath = argv[++i]; break;

		default: std::cerr << "Unknown switch.\n" << std::endl;
				 printHelp();
				 return -1;
		}



	if (iFileName.empty()) {
		std::cerr << "Option -i <filename> must be present! Aborting...\n";
		return -1;
	}
	if (oFileName.empty()) {
		std::cerr << "Option -o <filename> is missing. Output file name is set to 'output.jpg'\n";
		oFileName = "output.jpg";
	}

	src = imread(iFileName, cv::IMREAD_COLOR);
	namedWindow("Input image", CV_WINDOW_AUTOSIZE );
	imshow("Input image", src );

	std::cout << "Image " << iFileName << " consists of " << src.channels() << " channels and "
		<< src.cols << "x" << src.rows << " pixels.\n";

	//dst = imread(iFileName, CV_LOAD_IMAGE_COLOR); //src.clone();
	src.copyTo(dst);

	cols = src.cols;
	rows = src.rows;

	unsigned char **r, **g, **b;
	unsigned char *buffr, *buffg, *buffb;

	r = new unsigned char *[rows];
	g = new unsigned char *[rows];
	b = new unsigned char *[rows];

	buffr = new unsigned char[ cols * rows ];
	buffg = new unsigned char[ cols * rows ];
	buffb = new unsigned char[ cols * rows ];

	for (int i=0, disp=0; i<rows; i++, disp += cols)
		r[i] = & buffr[disp];
	for (int i=0, disp=0; i<rows; i++, disp += cols)
		g[i] = & buffg[disp];
	for (int i=0, disp=0; i<rows; i++, disp += cols)
		b[i] = & buffb[disp];

	fromMat2RGB(src, r, g, b);

	/*
	unsigned char *origr, *origg, *origb;
	if (! dFileName.empty()) {
		origr = new unsigned char[ cols * rows ];
		origg = new unsigned char[ cols * rows ];
		origb = new unsigned char[ cols * rows ];
		int rxc = rows*cols;
		for (i=0; i<rxc; i++) {
			origr[i] = buffr[i];
			origg[i] = buffg[i];
			origb[i] = buffb[i];
		}
	}
	*/

	GSFloodFill<unsigned char> *floodFill;


	floodFill = new GSFloodFill<unsigned char>(r, rows, cols);
	floodFill->setVerbose(verbose);
	if (! floodFill->Transform()) {
		std::cerr << "floodFill.Transform (r) has failed! Aborting...\n";
		return -1;
	}
	delete floodFill;

	floodFill = new GSFloodFill<unsigned char>(g, rows, cols);
	//GSFloodFill<unsigned char> floodFill(g, rows, cols);
	floodFill->setVerbose(verbose);
	if (! floodFill->Transform()) {
		std::cerr << "floodFill.Transform (g) has failed! Aborting...\n";
		return -1;
	}
	delete floodFill;

	floodFill = new GSFloodFill<unsigned char>(b, rows, cols);
	//GSFloodFill<unsigned char> floodFill(b, rows, cols);
	floodFill->setVerbose(verbose);
	if (! floodFill->Transform()) {
		std::cerr << "floodFill.Transform (b) has failed! Aborting...\n";
		return -1;
	}
	delete floodFill;


	// Now r, g and b point to the flood-filled transformation of the three input bands

	// (r,g,b) => dst
	fromRGB2Mat(dst, r, g, b);

	namedWindow( "Flood-filled image", CV_WINDOW_AUTOSIZE );
	imshow("Flood-filled image", dst );

	imwrite("FloodFilled.jpg", dst );



	if (! dFileName.empty()) {
		dst.copyTo(diff);
		diffMat(diff, src);

		namedWindow( "Difference image", CV_WINDOW_AUTOSIZE );
		imshow("Difference image", diff );
		imwrite("Difference.jpg", diff );
	}

	waitKey(0);
	return 0;
}